

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Opnd * __thiscall IR::Instr::SetFakeDst(Instr *this,Opnd *newDst)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  byte bVar4;
  undefined4 *puVar5;
  
  if (newDst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x8cb,"(newDst != nullptr)","Calling SetDst with a NULL dst");
    if (!bVar2) goto LAB_004b7323;
    *puVar5 = 0;
  }
  if (this->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x8cc,"(this->m_dst == nullptr)",
                       "Calling SetDst without unlinking/freeing the current dst");
    if (!bVar2) goto LAB_004b7323;
    *puVar5 = 0;
  }
  OVar3 = Opnd::GetKind(newDst);
  if (OVar3 == OpndKindReg) {
    OVar3 = Opnd::GetKind(newDst);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_004b7323;
      *puVar5 = 0;
    }
    if (((ushort)newDst[1].m_valueType.field_0 & 0x40) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x8cd,
                         "(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()))",
                         "!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen())");
      if (!bVar2) goto LAB_004b7323;
      *puVar5 = 0;
    }
  }
  func = this->m_func;
  if (newDst->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_004b7323:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar4 = newDst->field_0xb;
  if ((bVar4 & 2) != 0) {
    newDst = Opnd::Copy(newDst,func);
    bVar4 = newDst->field_0xb;
  }
  newDst->field_0xb = bVar4 | 2;
  this->m_dst = newDst;
  newDst->field_0xb = newDst->field_0xb | 0x80;
  return newDst;
}

Assistant:

Opnd *
Instr::SetFakeDst(Opnd * newDst)
{
    AssertMsg(newDst != nullptr, "Calling SetDst with a NULL dst");
    AssertMsg(this->m_dst == nullptr, "Calling SetDst without unlinking/freeing the current dst");
    Assert(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()));

    newDst = newDst->Use(m_func);
    this->m_dst = newDst;

#if DBG
    newDst->isFakeDst = true;
#endif
    return newDst;
}